

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3SchemaToIndex(sqlite3 *db,Schema *pSchema)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (pSchema == (Schema *)0x0) {
    uVar1 = 0xfff0bdc0;
  }
  else {
    uVar2 = 0;
    uVar1 = (ulong)(uint)db->nDb;
    if (db->nDb < 1) {
      uVar1 = uVar2;
    }
    lVar3 = 0x18;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (*(Schema **)((long)&db->aDb->zDbSName + lVar3) == pSchema) {
        return (int)uVar2;
      }
      lVar3 = lVar3 + 0x20;
    }
  }
  return (int)uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3SchemaToIndex(sqlite3 *db, Schema *pSchema){
  int i = -1000000;

  /* If pSchema is NULL, then return -1000000. This happens when code in 
  ** expr.c is trying to resolve a reference to a transient table (i.e. one
  ** created by a sub-select). In this case the return value of this 
  ** function should never be used.
  **
  ** We return -1000000 instead of the more usual -1 simply because using
  ** -1000000 as the incorrect index into db->aDb[] is much 
  ** more likely to cause a segfault than -1 (of course there are assert()
  ** statements too, but it never hurts to play the odds).
  */
  assert( sqlite3_mutex_held(db->mutex) );
  if( pSchema ){
    for(i=0; ALWAYS(i<db->nDb); i++){
      if( db->aDb[i].pSchema==pSchema ){
        break;
      }
    }
    assert( i>=0 && i<db->nDb );
  }
  return i;
}